

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O1

bool __thiscall
UnifiedRegex::Parser<UTF8EncodingPolicyBase<false>,_false>::SurrogatePairPass1
          (Parser<UTF8EncodingPolicyBase<false>,_false> *this,Node **node,
          MatchCharNode *deferredCharNode,bool *previousSurrogatePart)

{
  undefined1 *puVar1;
  uint l;
  SurrogatePairTracker *pSVar2;
  code *pcVar3;
  codepoint_t cVar4;
  bool bVar5;
  undefined4 *puVar6;
  Node *pNVar7;
  AltNode *pAVar8;
  AltNode *pAVar9;
  long lVar10;
  int i;
  long lVar11;
  ulong uVar12;
  uint uVar13;
  AltNode *local_88;
  Node *equivNode [4];
  codepoint_t local_58 [2];
  codepoint_t equivClass [4];
  uint tableIndex;
  uint actualHigh;
  char16 local_34;
  char16 local_32 [3];
  char16 lower;
  char16 upper;
  
  if ((((((this->scriptContext->config).threadConfig)->m_ES6Unicode == true) &&
       (this->unicodeFlagPresent == true)) &&
      (pSVar2 = this->currentSurrogatePairNode, pSVar2 != (SurrogatePairTracker *)0x0)) &&
     (pSVar2->location == this->next)) {
    if (pSVar2->rangeLocation != (EncodedChar *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0x723,"(!this->currentSurrogatePairNode->IsInsideRange())",
                         "Should not be calling this pass if we are currently inside a range.");
      if (!bVar5) goto LAB_00edc6b4;
      *puVar6 = 0;
    }
    equivClass[2] = 0;
    equivClass[3] = 0;
    if ((this->caseInsensitiveFlagPresent == true) &&
       (l = this->currentSurrogatePairNode->value,
       bVar5 = CaseInsensitive::RangeToEquivClass(equivClass + 2,l,l,equivClass + 3,local_58), bVar5
       )) {
      lVar11 = 0;
      uVar13 = 0;
      do {
        if (lVar11 != 0) {
          lVar10 = 0;
          do {
            if (local_58[lVar11] == local_58[lVar10]) goto LAB_00edc44d;
            lVar10 = lVar10 + 1;
          } while (lVar11 != lVar10);
        }
        bVar5 = Js::NumberUtilities::IsInSupplementaryPlane(local_58[lVar11]);
        if (bVar5) {
          Js::NumberUtilities::CodePointAsSurrogatePair(local_58[lVar11],&local_34,local_32);
          pNVar7 = CreateSurrogatePairAtom(this,local_34,local_32[0]);
        }
        else {
          pNVar7 = (Node *)new<Memory::ArenaAllocator>(0x48,this->ctAllocator,0x366bee);
          cVar4 = local_58[lVar11];
          pNVar7->tag = MatchChar;
          pNVar7->features = 0;
          *(uint *)&pNVar7->field_0xc = *(uint *)&pNVar7->field_0xc & 0xffff8000;
          pNVar7->firstSet = (CharSet<char16_t> *)0x0;
          pNVar7->followSet = (CharSet<char16_t> *)0x0;
          (pNVar7->prevConsumes).lower = 0;
          *(undefined8 *)&(pNVar7->prevConsumes).upper = 0xffffffff;
          *(undefined8 *)&(pNVar7->thisConsumes).upper = 0xffffffff;
          (pNVar7->followConsumes).upper = 0xffffffff;
          pNVar7->_vptr_Node = (_func_int **)&PTR_LiteralLength_01558ef0;
          *(undefined1 *)&pNVar7[1].tag = Empty;
          *(short *)&pNVar7[1]._vptr_Node = (short)cVar4;
          lVar10 = 0x1d;
          do {
            *(short *)((long)&pNVar7->_vptr_Node + lVar10 * 2) = (short)cVar4;
            lVar10 = lVar10 + 1;
          } while (lVar10 != 0x20);
        }
        equivNode[(long)(int)uVar13 + -1] = pNVar7;
        uVar13 = uVar13 + 1;
LAB_00edc44d:
        lVar11 = lVar11 + 1;
      } while (lVar11 != 4);
      if ((int)uVar13 < 1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0x748,"(indexForNextNode > 0)","indexForNextNode > 0");
        if (!bVar5) goto LAB_00edc6b4;
        *puVar6 = 0;
      }
      if (uVar13 != 1) {
        pAVar8 = (AltNode *)new<Memory::ArenaAllocator>(0x60,this->ctAllocator,0x366bee);
        AltNode::AltNode(pAVar8,&local_88->super_Node,(AltNode *)0x0);
        local_88 = pAVar8;
        if (1 < (int)uVar13) {
          uVar12 = 1;
          equivNode[3] = (Node *)&PTR_LiteralLength_01559190;
          do {
            pAVar9 = (AltNode *)new<Memory::ArenaAllocator>(0x60,this->ctAllocator,0x366bee);
            pNVar7 = equivNode[uVar12 - 1];
            (pAVar9->super_Node).tag = Alt;
            (pAVar9->super_Node).features = 0;
            puVar1 = &(pAVar9->super_Node).field_0xc;
            *(uint *)puVar1 = *(uint *)puVar1 & 0xffff8000;
            (pAVar9->super_Node).prevConsumes.lower = 0;
            (pAVar9->super_Node).firstSet = (CharSet<char16_t> *)0x0;
            (pAVar9->super_Node).followSet = (CharSet<char16_t> *)0x0;
            *(undefined8 *)&(pAVar9->super_Node).prevConsumes.upper = 0xffffffff;
            *(undefined8 *)&(pAVar9->super_Node).thisConsumes.upper = 0xffffffff;
            (pAVar9->super_Node).followConsumes.upper = 0xffffffff;
            (pAVar9->super_Node)._vptr_Node = (_func_int **)equivNode[3];
            pAVar9->head = pNVar7;
            pAVar9->switchSize = 0;
            pAVar9->tail = (AltNode *)0x0;
            pAVar9->runtimeTrie = (RuntimeCharTrie *)0x0;
            *(undefined8 *)((long)&pAVar9->runtimeTrie + 5) = 0;
            pAVar8->tail = pAVar9;
            uVar12 = uVar12 + 1;
            pAVar8 = pAVar9;
          } while (uVar13 != uVar12);
        }
      }
      *node = &local_88->super_Node;
    }
    else {
      Js::NumberUtilities::CodePointAsSurrogatePair
                (this->currentSurrogatePairNode->value,&local_34,local_32);
      pNVar7 = CreateSurrogatePairAtom(this,local_34,local_32[0]);
      *node = pNVar7;
    }
    *previousSurrogatePart = false;
    if (this->inputLim < this->next + this->currentSurrogatePairNode->length) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0x761,"(ECCanConsume(this->currentSurrogatePairNode->length))",
                         "ECCanConsume(this->currentSurrogatePairNode->length)");
      if (!bVar5) goto LAB_00edc6b4;
      *puVar6 = 0;
    }
    uVar13 = this->currentSurrogatePairNode->length;
    if (this->inputLim < this->next + uVar13) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0xde,"(next + n <= inputLim)","next + n <= inputLim");
      if (!bVar5) {
LAB_00edc6b4:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar6 = 0;
    }
    this->next = this->next + uVar13;
    pSVar2 = this->currentSurrogatePairNode;
    (this->super_UTF8EncodingPolicyBase<false>).m_cMultiUnits = pSVar2->multiUnits;
    this->currentSurrogatePairNode = pSVar2->next;
    bVar5 = true;
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool Parser<P, IsLiteral>::SurrogatePairPass1(Node*& node, MatchCharNode* deferredCharNode, bool& previousSurrogatePart)
    {
        if (!this->scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled() || !unicodeFlagPresent)
        {
            return false;
        }

        if (this->currentSurrogatePairNode != nullptr && this->currentSurrogatePairNode->location == this->next)
        {
            AssertMsg(!this->currentSurrogatePairNode->IsInsideRange(), "Should not be calling this pass if we are currently inside a range.");
            char16 lower, upper;

            uint tableIndex = 0, actualHigh = 0;
            codepoint_t equivClass[CaseInsensitive::EquivClassSize];

            if (caseInsensitiveFlagPresent && CaseInsensitive::RangeToEquivClass(tableIndex, this->currentSurrogatePairNode->value, this->currentSurrogatePairNode->value, actualHigh, equivClass))
            {
                Node *equivNode[CaseInsensitive::EquivClassSize];
                int indexForNextNode = 0;
                for (int i = 0; i < CaseInsensitive::EquivClassSize; i++)
                {
                    bool alreadyAdded = false;

                    for (int j = 0; j < i; j++)
                    {
                        if (equivClass[i] == equivClass[j])
                        {
                            alreadyAdded = true;
                            break;
                        }
                    }

                    if (!alreadyAdded)
                    {
                        if (Js::NumberUtilities::IsInSupplementaryPlane(equivClass[i]))
                        {
                            Js::NumberUtilities::CodePointAsSurrogatePair(equivClass[i], &lower, &upper);
                            equivNode[indexForNextNode] = CreateSurrogatePairAtom(lower, upper);
                        }
                        else
                        {
                            equivNode[indexForNextNode] = Anew(ctAllocator, MatchCharNode, (Char)equivClass[i]);
                        }
                        indexForNextNode ++;
                    }
                }
                Assert(indexForNextNode > 0);
                if (indexForNextNode == 1)
                {
                    node = equivNode[0];
                }
                else
                {
                    AltNode *altNode = Anew(ctAllocator, AltNode, equivNode[0], nullptr);
                    AltNode *altNodeTail = altNode;
                    for (int i = 1; i < indexForNextNode; i++)
                    {
                        altNodeTail->tail = Anew(ctAllocator, AltNode, equivNode[i], nullptr);
                        altNodeTail = altNodeTail->tail;
                    }
                    node = altNode;
                }
            }
            else
            {
                Js::NumberUtilities::CodePointAsSurrogatePair(this->currentSurrogatePairNode->value, &lower, &upper);
                node = CreateSurrogatePairAtom(lower, upper);
            }

            previousSurrogatePart = false;

            Assert(ECCanConsume(this->currentSurrogatePairNode->length));
            ECConsumeMultiUnit(this->currentSurrogatePairNode->length);
            this->RestoreMultiUnits(this->currentSurrogatePairNode->multiUnits);
            this->currentSurrogatePairNode = this->currentSurrogatePairNode->next;

            return true;
        }

        return false;
    }